

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O3

Vec_Str_t * Acb_GeneratePatch2(Gia_Man_t *pGia,Vec_Ptr_t *vIns,Vec_Ptr_t *vOuts)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  void **__ptr;
  void *__ptr_00;
  size_t sVar4;
  bool bVar5;
  uint uVar6;
  Vec_Wec_t *vGates;
  ulong uVar7;
  Vec_Ptr_t *__ptr_01;
  Vec_Str_t *p;
  char *pcVar8;
  int iVar9;
  int iVar10;
  int i_8;
  Vec_Int_t *pVVar11;
  int i_1;
  uint uVar12;
  int i;
  long lVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  
  iVar10 = 0;
  vGates = Abc_GiaSynthesize((Vec_Ptr_t *)0x0,pGia);
  uVar2 = vIns->nSize;
  uVar7 = (ulong)uVar2;
  uVar3 = vOuts->nSize;
  iVar9 = vGates->nSize;
  __ptr_01 = Acb_GenerateSignalNames2(vGates,vIns,vOuts);
  p = (Vec_Str_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  pcVar8 = (char *)malloc(100);
  p->pArray = pcVar8;
  lVar13 = 0;
  while( true ) {
    cVar1 = "module patch ("[lVar13];
    if (iVar10 == p->nCap) {
      if (iVar10 < 0x10) {
        if (p->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(0x10);
        }
        else {
          pcVar8 = (char *)realloc(p->pArray,0x10);
        }
        p->pArray = pcVar8;
        p->nCap = 0x10;
      }
      else {
        uVar12 = iVar10 * 2;
        if (p->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc((ulong)uVar12);
        }
        else {
          pcVar8 = (char *)realloc(p->pArray,(ulong)uVar12);
        }
        p->pArray = pcVar8;
        p->nCap = uVar12;
      }
    }
    else {
      pcVar8 = p->pArray;
    }
    iVar10 = p->nSize;
    p->nSize = iVar10 + 1;
    pcVar8[iVar10] = cVar1;
    if (lVar13 == 0xd) break;
    iVar10 = p->nSize;
    lVar13 = lVar13 + 1;
  }
  if (0 < vOuts->nSize) {
    lVar13 = 0;
    do {
      pcVar8 = ",";
      if (lVar13 == 0) {
        pcVar8 = "";
      }
      Vec_StrPrintF(p,"%s %s",pcVar8,vOuts->pArray[lVar13]);
      lVar13 = lVar13 + 1;
    } while (lVar13 < vOuts->nSize);
  }
  if (0 < vIns->nSize) {
    lVar13 = 0;
    do {
      Vec_StrPrintF(p,", %s",vIns->pArray[lVar13]);
      lVar13 = lVar13 + 1;
    } while (lVar13 < vIns->nSize);
  }
  uVar12 = iVar9 - (uVar2 + uVar3);
  lVar13 = 0;
  do {
    cVar1 = "\n  );\n\n"[lVar13 + 2];
    uVar6 = p->nSize;
    if (uVar6 == p->nCap) {
      if ((int)uVar6 < 0x10) {
        if (p->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(0x10);
        }
        else {
          pcVar8 = (char *)realloc(p->pArray,0x10);
        }
        p->pArray = pcVar8;
        p->nCap = 0x10;
      }
      else {
        sVar4 = (ulong)uVar6 * 2;
        if (p->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(sVar4);
        }
        else {
          pcVar8 = (char *)realloc(p->pArray,sVar4);
        }
        p->pArray = pcVar8;
        p->nCap = (int)sVar4;
      }
    }
    else {
      pcVar8 = p->pArray;
    }
    iVar9 = p->nSize;
    p->nSize = iVar9 + 1;
    pcVar8[iVar9] = cVar1;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 5);
  lVar13 = 0;
  do {
    cVar1 = "  output"[lVar13];
    uVar6 = p->nSize;
    if (uVar6 == p->nCap) {
      if ((int)uVar6 < 0x10) {
        if (p->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(0x10);
        }
        else {
          pcVar8 = (char *)realloc(p->pArray,0x10);
        }
        p->pArray = pcVar8;
        p->nCap = 0x10;
      }
      else {
        sVar4 = (ulong)uVar6 * 2;
        if (p->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(sVar4);
        }
        else {
          pcVar8 = (char *)realloc(p->pArray,sVar4);
        }
        p->pArray = pcVar8;
        p->nCap = (int)sVar4;
      }
    }
    else {
      pcVar8 = p->pArray;
    }
    iVar9 = p->nSize;
    p->nSize = iVar9 + 1;
    pcVar8[iVar9] = cVar1;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 8);
  if (0 < vOuts->nSize) {
    lVar13 = 0;
    do {
      pcVar8 = ",";
      if (lVar13 == 0) {
        pcVar8 = "";
      }
      Vec_StrPrintF(p,"%s %s",pcVar8,vOuts->pArray[lVar13]);
      lVar13 = lVar13 + 1;
    } while (lVar13 < vOuts->nSize);
  }
  lVar13 = 0;
  do {
    cVar1 = " .%s(%s) ) ;\n"[lVar13 + 0xb];
    uVar6 = p->nSize;
    if (uVar6 == p->nCap) {
      if ((int)uVar6 < 0x10) {
        if (p->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(0x10);
        }
        else {
          pcVar8 = (char *)realloc(p->pArray,0x10);
        }
        p->pArray = pcVar8;
        p->nCap = 0x10;
      }
      else {
        sVar4 = (ulong)uVar6 * 2;
        if (p->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(sVar4);
        }
        else {
          pcVar8 = (char *)realloc(p->pArray,sVar4);
        }
        p->pArray = pcVar8;
        p->nCap = (int)sVar4;
      }
    }
    else {
      pcVar8 = p->pArray;
    }
    iVar9 = p->nSize;
    p->nSize = iVar9 + 1;
    pcVar8[iVar9] = cVar1;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 2);
  lVar13 = 0;
  do {
    cVar1 = "  input"[lVar13];
    uVar6 = p->nSize;
    if (uVar6 == p->nCap) {
      if ((int)uVar6 < 0x10) {
        if (p->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(0x10);
        }
        else {
          pcVar8 = (char *)realloc(p->pArray,0x10);
        }
        p->pArray = pcVar8;
        p->nCap = 0x10;
      }
      else {
        sVar4 = (ulong)uVar6 * 2;
        if (p->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(sVar4);
        }
        else {
          pcVar8 = (char *)realloc(p->pArray,sVar4);
        }
        p->pArray = pcVar8;
        p->nCap = (int)sVar4;
      }
    }
    else {
      pcVar8 = p->pArray;
    }
    iVar9 = p->nSize;
    p->nSize = iVar9 + 1;
    pcVar8[iVar9] = cVar1;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 7);
  if (0 < vIns->nSize) {
    lVar13 = 0;
    do {
      pcVar8 = ",";
      if (lVar13 == 0) {
        pcVar8 = "";
      }
      Vec_StrPrintF(p,"%s %s",pcVar8,vIns->pArray[lVar13]);
      lVar13 = lVar13 + 1;
    } while (lVar13 < vIns->nSize);
  }
  lVar13 = 0;
  do {
    cVar1 = " .%s(%s) ) ;\n"[lVar13 + 0xb];
    uVar6 = p->nSize;
    if (uVar6 == p->nCap) {
      if ((int)uVar6 < 0x10) {
        if (p->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(0x10);
        }
        else {
          pcVar8 = (char *)realloc(p->pArray,0x10);
        }
        p->pArray = pcVar8;
        p->nCap = 0x10;
      }
      else {
        sVar4 = (ulong)uVar6 * 2;
        if (p->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(sVar4);
        }
        else {
          pcVar8 = (char *)realloc(p->pArray,sVar4);
        }
        p->pArray = pcVar8;
        p->nCap = (int)sVar4;
      }
    }
    else {
      pcVar8 = p->pArray;
    }
    iVar9 = p->nSize;
    p->nSize = iVar9 + 1;
    pcVar8[iVar9] = cVar1;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 2);
  if ((int)uVar3 < (int)uVar12) {
    lVar13 = 0;
    do {
      cVar1 = "  wire"[lVar13];
      uVar6 = p->nSize;
      if (uVar6 == p->nCap) {
        if ((int)uVar6 < 0x10) {
          if (p->pArray == (char *)0x0) {
            pcVar8 = (char *)malloc(0x10);
          }
          else {
            pcVar8 = (char *)realloc(p->pArray,0x10);
          }
          p->pArray = pcVar8;
          p->nCap = 0x10;
        }
        else {
          sVar4 = (ulong)uVar6 * 2;
          if (p->pArray == (char *)0x0) {
            pcVar8 = (char *)malloc(sVar4);
          }
          else {
            pcVar8 = (char *)realloc(p->pArray,sVar4);
          }
          p->pArray = pcVar8;
          p->nCap = (int)sVar4;
        }
      }
      else {
        pcVar8 = p->pArray;
      }
      iVar9 = p->nSize;
      p->nSize = iVar9 + 1;
      pcVar8[iVar9] = cVar1;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 6);
    if (0 < (int)uVar12) {
      bVar5 = true;
      uVar14 = (ulong)uVar12;
      uVar16 = uVar7;
      do {
        if (((int)uVar2 < 0) || (__ptr_01->nSize <= (int)uVar16)) goto LAB_0039b5be;
        if ((*__ptr_01->pArray[uVar16] == 'w') &&
           (*(char *)((long)__ptr_01->pArray[uVar16] + 1) == 'w')) {
          pcVar8 = "";
          if (!bVar5) {
            pcVar8 = ",";
          }
          bVar5 = false;
          Vec_StrPrintF(p,"%s %s",pcVar8);
        }
        uVar16 = uVar16 + 1;
        uVar14 = uVar14 - 1;
      } while (uVar14 != 0);
    }
    lVar13 = 0;
    do {
      cVar1 = "\n);\n\n"[lVar13 + 2];
      uVar6 = p->nSize;
      if (uVar6 == p->nCap) {
        if ((int)uVar6 < 0x10) {
          if (p->pArray == (char *)0x0) {
            pcVar8 = (char *)malloc(0x10);
          }
          else {
            pcVar8 = (char *)realloc(p->pArray,0x10);
          }
          p->pArray = pcVar8;
          p->nCap = 0x10;
        }
        else {
          sVar4 = (ulong)uVar6 * 2;
          if (p->pArray == (char *)0x0) {
            pcVar8 = (char *)malloc(sVar4);
          }
          else {
            pcVar8 = (char *)realloc(p->pArray,sVar4);
          }
          p->pArray = pcVar8;
          p->nCap = (int)sVar4;
        }
      }
      else {
        pcVar8 = p->pArray;
      }
      iVar9 = p->nSize;
      p->nSize = iVar9 + 1;
      pcVar8[iVar9] = cVar1;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 3);
  }
  if (0 < (int)uVar12) {
    uVar14 = uVar7;
    do {
      if (((int)uVar2 < 0) || (vGates->nSize <= (int)uVar14)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pVVar11 = vGates->pArray;
      if (pVVar11[uVar14].nSize < 3) {
        if (pVVar11[uVar14].nSize < 1) {
LAB_0039b5fc:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (1 < *pVVar11[uVar14].pArray - 7U) {
          __assert_fail("Vec_IntEntry(vGate, 0) == ABC_OPER_CONST_F || Vec_IntEntry(vGate, 0) == ABC_OPER_CONST_T"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                        ,0x870,
                        "Vec_Str_t *Acb_GeneratePatch2(Gia_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
        }
        Vec_StrPrintF(p,"  %s (","buf");
        if (pVVar11[uVar14].nSize < 2) goto LAB_0039b5fc;
        iVar9 = pVVar11[uVar14].pArray[1];
        if (((long)iVar9 < 0) || (__ptr_01->nSize <= iVar9)) {
LAB_0039b5be:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        Vec_StrPrintF(p," %s, ",__ptr_01->pArray[iVar9]);
        if (pVVar11[uVar14].nSize < 1) goto LAB_0039b5fc;
        Vec_StrPrintF(p," 1\'b%d",(ulong)(*pVVar11[uVar14].pArray == 8));
        Vec_StrPrintF(p," );\n");
      }
      else {
        uVar6 = *pVVar11[uVar14].pArray - 7;
        if ((0xb < uVar6) || ((0xff3U >> (uVar6 & 0x1f) & 1) == 0)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                        ,0x66,"char *Acb_Oper2Name(int)");
        }
        Vec_StrPrintF(p,"  %s (",(&PTR_anon_var_dwarf_ab6b2_00bbd190)[uVar6]);
        if (1 < pVVar11[uVar14].nSize) {
          uVar16 = 1;
          do {
            iVar9 = pVVar11[uVar14].pArray[uVar16];
            pcVar8 = "";
            if (1 < uVar16) {
              pcVar8 = ",";
            }
            if (((long)iVar9 < 0) || (__ptr_01->nSize <= iVar9)) goto LAB_0039b5be;
            Vec_StrPrintF(p,"%s %s",pcVar8,__ptr_01->pArray[iVar9]);
            uVar16 = uVar16 + 1;
          } while ((long)uVar16 < (long)pVVar11[uVar14].nSize);
        }
        lVar13 = 0;
        do {
          cVar1 = "\n  );\n"[lVar13 + 2];
          uVar6 = p->nSize;
          if (uVar6 == p->nCap) {
            if ((int)uVar6 < 0x10) {
              if (p->pArray == (char *)0x0) {
                pcVar8 = (char *)malloc(0x10);
              }
              else {
                pcVar8 = (char *)realloc(p->pArray,0x10);
              }
              p->pArray = pcVar8;
              p->nCap = 0x10;
            }
            else {
              sVar4 = (ulong)uVar6 * 2;
              if (p->pArray == (char *)0x0) {
                pcVar8 = (char *)malloc(sVar4);
              }
              else {
                pcVar8 = (char *)realloc(p->pArray,sVar4);
              }
              p->pArray = pcVar8;
              p->nCap = (int)sVar4;
            }
          }
          else {
            pcVar8 = p->pArray;
          }
          iVar9 = p->nSize;
          p->nSize = iVar9 + 1;
          pcVar8[iVar9] = cVar1;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 4);
      }
      uVar14 = uVar14 + 1;
    } while ((int)uVar14 < (int)(uVar12 + uVar2));
  }
  lVar13 = 0;
  do {
    cVar1 = "\nendmodule\n\n"[lVar13];
    uVar2 = p->nSize;
    if (uVar2 == p->nCap) {
      if ((int)uVar2 < 0x10) {
        if (p->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(0x10);
        }
        else {
          pcVar8 = (char *)realloc(p->pArray,0x10);
        }
        p->pArray = pcVar8;
        p->nCap = 0x10;
      }
      else {
        sVar4 = (ulong)uVar2 * 2;
        if (p->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(sVar4);
        }
        else {
          pcVar8 = (char *)realloc(p->pArray,sVar4);
        }
        p->pArray = pcVar8;
        p->nCap = (int)sVar4;
      }
    }
    else {
      pcVar8 = p->pArray;
    }
    iVar9 = p->nSize;
    p->nSize = iVar9 + 1;
    pcVar8[iVar9] = cVar1;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 0xc);
  uVar2 = p->nSize;
  if (uVar2 == p->nCap) {
    if ((int)uVar2 < 0x10) {
      if (p->pArray == (char *)0x0) {
        pcVar8 = (char *)malloc(0x10);
      }
      else {
        pcVar8 = (char *)realloc(p->pArray,0x10);
      }
      p->pArray = pcVar8;
      p->nCap = 0x10;
    }
    else {
      sVar4 = (ulong)uVar2 * 2;
      if (p->pArray == (char *)0x0) {
        pcVar8 = (char *)malloc(sVar4);
      }
      else {
        pcVar8 = (char *)realloc(p->pArray,sVar4);
      }
      p->pArray = pcVar8;
      p->nCap = (int)sVar4;
    }
  }
  else {
    pcVar8 = p->pArray;
  }
  iVar9 = p->nSize;
  p->nSize = iVar9 + 1;
  pcVar8[iVar9] = '\0';
  if (__ptr_01 != (Vec_Ptr_t *)0x0) {
    iVar9 = __ptr_01->nSize;
    __ptr = __ptr_01->pArray;
    if ((long)iVar9 < 1) {
      if (__ptr != (void **)0x0) goto LAB_0039b529;
    }
    else {
      lVar13 = 0;
      do {
        if ((void *)0x2 < __ptr[lVar13]) {
          free(__ptr[lVar13]);
        }
        lVar13 = lVar13 + 1;
      } while (iVar9 != lVar13);
LAB_0039b529:
      free(__ptr);
    }
    free(__ptr_01);
  }
  iVar9 = vGates->nCap;
  pVVar11 = vGates->pArray;
  if (iVar9 < 1) {
    if (pVVar11 == (Vec_Int_t *)0x0) goto LAB_0039b589;
  }
  else {
    lVar13 = 8;
    lVar15 = 0;
    do {
      __ptr_00 = *(void **)((long)&pVVar11->nCap + lVar13);
      if (__ptr_00 != (void *)0x0) {
        free(__ptr_00);
        pVVar11 = vGates->pArray;
        *(undefined8 *)((long)&pVVar11->nCap + lVar13) = 0;
        iVar9 = vGates->nCap;
      }
      lVar15 = lVar15 + 1;
      lVar13 = lVar13 + 0x10;
    } while (lVar15 < iVar9);
  }
  free(pVVar11);
LAB_0039b589:
  free(vGates);
  printf("Synthesized patch with %d inputs, %d outputs and %d gates.\n",uVar7,(ulong)uVar3,
         (ulong)uVar12);
  return p;
}

Assistant:

Vec_Str_t * Acb_GeneratePatch2( Gia_Man_t * pGia, Vec_Ptr_t * vIns, Vec_Ptr_t * vOuts )
{
    extern Vec_Wec_t * Abc_GiaSynthesize( Vec_Ptr_t * vGias, Gia_Man_t * pMulti );
    Vec_Wec_t * vGates = Abc_GiaSynthesize( NULL, pGia );  Vec_Int_t * vGate;
    int nIns = Vec_PtrSize(vIns), nOuts = Vec_PtrSize(vOuts); char * pName;
    int i, k, iObj, nWires = Vec_WecSize(vGates) - nIns - nOuts, fFirst = 1;
    Vec_Ptr_t * vNames = Acb_GenerateSignalNames2( vGates, vIns, vOuts );

    Vec_Str_t * vStr = Vec_StrAlloc( 100 );
    Vec_StrAppend( vStr, "module patch (" );

    Vec_PtrForEachEntry( char *, vOuts, pName, i )
        Vec_StrPrintF( vStr, "%s %s", i ? ",":"", pName );
    Vec_PtrForEachEntry( char *, vIns, pName, i )
        Vec_StrPrintF( vStr, ", %s", pName );
    Vec_StrAppend( vStr, " );\n\n" );

    Vec_StrAppend( vStr, "  output" );
    Vec_PtrForEachEntry( char *, vOuts, pName, i )
        Vec_StrPrintF( vStr, "%s %s", i ? ",":"", pName );
    Vec_StrAppend( vStr, ";\n" );

    Vec_StrAppend( vStr, "  input" );
    Vec_PtrForEachEntry( char *, vIns, pName, i )
        Vec_StrPrintF( vStr, "%s %s", i ? ",":"", pName );
    Vec_StrAppend( vStr, ";\n" );

    if ( nWires > nOuts )
    {
        Vec_StrAppend( vStr, "  wire" );
        for ( i = 0; i < nWires; i++ )
        {
            char * pName = (char *)Vec_PtrEntry( vNames, nIns+i );
            if ( !strncmp(pName, "ww", 2) )
                Vec_StrPrintF( vStr, "%s %s", fFirst ? "":",", pName ), fFirst = 0;
        }
        Vec_StrAppend( vStr, ";\n\n" );
    }

    // create internal nodes
    Vec_WecForEachLevelStartStop( vGates, vGate, i, nIns, nIns+nWires )
    {
        if ( Vec_IntSize(vGate) > 2 )
        {
            Vec_StrPrintF( vStr, "  %s (", Acb_Oper2Name(Vec_IntEntry(vGate, 0)) );
            Vec_IntForEachEntryStart( vGate, iObj, k, 1 )
                Vec_StrPrintF( vStr, "%s %s", k > 1 ? ",":"", (char *)Vec_PtrEntry(vNames, iObj) );
            Vec_StrAppend( vStr, " );\n" );
        }
        else
        {
            assert( Vec_IntEntry(vGate, 0) == ABC_OPER_CONST_F || Vec_IntEntry(vGate, 0) == ABC_OPER_CONST_T );
            Vec_StrPrintF( vStr, "  %s (", Acb_Oper2Name( ABC_OPER_BIT_BUF ) );
            Vec_StrPrintF( vStr, " %s, ", (char *)Vec_PtrEntry(vNames, Vec_IntEntry(vGate, 1)) );
            Vec_StrPrintF( vStr, " 1\'b%d", Vec_IntEntry(vGate, 0) == ABC_OPER_CONST_T );
            Vec_StrPrintF( vStr, " );\n" );
        }
    }
    Vec_StrAppend( vStr, "\nendmodule\n\n" );
    Vec_StrPush( vStr, '\0' );
    Vec_PtrFreeFree( vNames );
    Vec_WecFree( vGates );

    printf( "Synthesized patch with %d inputs, %d outputs and %d gates.\n", nIns, nOuts, nWires );
    return vStr;
}